

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

QTextStream * __thiscall QTextStream::operator>>(QTextStream *this,float *f)

{
  QTextStreamPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  double tmp;
  undefined4 uStack_30;
  undefined8 uStack_2c;
  undefined4 local_24;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((pQVar1->string == (QString *)0x0) && (pQVar1->device == (QIODevice *)0x0)) {
    tmp._0_4_ = 2;
    local_24 = 0;
    tmp._4_4_ = 0;
    uStack_30 = 0;
    uStack_2c = 0;
    local_20 = "default";
    QMessageLogger::warning((QMessageLogger *)&tmp,"QTextStream: No device");
  }
  else {
    tmp._0_4_ = 0xffffffff;
    tmp._4_4_ = 0xffffffff;
    bVar2 = QTextStreamPrivate::getReal(pQVar1,&tmp);
    if (bVar2) {
      *f = (float)(double)CONCAT44(tmp._4_4_,tmp._0_4_);
    }
    else {
      *f = 0.0;
      bVar2 = atEnd(this);
      pQVar1 = (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
               _M_t.
               super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
               .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
      if (pQVar1->status == Ok) {
        pQVar1->status = ReadCorruptData - bVar2;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator>>(float &f)
{
    IMPLEMENT_STREAM_RIGHT_REAL_OPERATOR(float);
}